

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::CovergroupDeclarationSyntax::setChild
          (CovergroupDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  SyntaxList<slang::syntax::MemberSyntax> *pSVar2;
  SyntaxNode *pSVar3;
  logic_error *this_00;
  Token TVar4;
  NamedBlockClauseSyntax *local_168;
  SyntaxNode *local_160;
  FunctionPortListSyntax *local_158;
  string local_130;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined8 local_58;
  Info *local_50;
  undefined8 local_48;
  Info *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  CovergroupDeclarationSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    pSVar3 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (pSVar3);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (&(this->super_MemberSyntax).attributes,pSVar1);
    break;
  case 1:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar4._0_8_;
    (this->covergroup).kind = (undefined2)local_28;
    (this->covergroup).field_0x2 = local_28._2_1_;
    (this->covergroup).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->covergroup).rawLen = local_28._4_4_;
    local_20 = TVar4.info;
    (this->covergroup).info = local_20;
    break;
  case 2:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar4._0_8_;
    (this->name).kind = (undefined2)local_38;
    (this->name).field_0x2 = local_38._2_1_;
    (this->name).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->name).rawLen = local_38._4_4_;
    local_30 = TVar4.info;
    (this->name).info = local_30;
    break;
  case 3:
    pSVar3 = TokenOrSyntax::node(&child);
    if (pSVar3 == (SyntaxNode *)0x0) {
      local_158 = (FunctionPortListSyntax *)0x0;
    }
    else {
      pSVar3 = TokenOrSyntax::node(&child);
      local_158 = SyntaxNode::as<slang::syntax::FunctionPortListSyntax>(pSVar3);
    }
    this->portList = local_158;
    break;
  case 4:
    pSVar3 = TokenOrSyntax::node(&child);
    if (pSVar3 == (SyntaxNode *)0x0) {
      local_160 = (SyntaxNode *)0x0;
    }
    else {
      pSVar3 = TokenOrSyntax::node(&child);
      local_160 = SyntaxNode::as<slang::syntax::SyntaxNode>(pSVar3);
    }
    this->event = local_160;
    break;
  case 5:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar4._0_8_;
    (this->semi).kind = (undefined2)local_48;
    (this->semi).field_0x2 = local_48._2_1_;
    (this->semi).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->semi).rawLen = local_48._4_4_;
    local_40 = TVar4.info;
    (this->semi).info = local_40;
    break;
  case 6:
    pSVar3 = TokenOrSyntax::node(&child);
    pSVar2 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::MemberSyntax>>(pSVar3);
    SyntaxList<slang::syntax::MemberSyntax>::operator=(&this->members,pSVar2);
    break;
  case 7:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_58 = TVar4._0_8_;
    (this->endgroup).kind = (undefined2)local_58;
    (this->endgroup).field_0x2 = local_58._2_1_;
    (this->endgroup).numFlags = (NumericTokenFlags)local_58._3_1_;
    (this->endgroup).rawLen = local_58._4_4_;
    local_50 = TVar4.info;
    (this->endgroup).info = local_50;
    break;
  case 8:
    pSVar3 = TokenOrSyntax::node(&child);
    if (pSVar3 == (SyntaxNode *)0x0) {
      local_168 = (NamedBlockClauseSyntax *)0x0;
    }
    else {
      pSVar3 = TokenOrSyntax::node(&child);
      local_168 = SyntaxNode::as<slang::syntax::NamedBlockClauseSyntax>(pSVar3);
    }
    this->endBlockName = local_168;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_f9);
    std::operator+(&local_d8,&local_f8,":");
    std::__cxx11::to_string(&local_130,0xd80);
    std::operator+(&local_b8,&local_d8,&local_130);
    std::operator+(&local_98,&local_b8,": ");
    std::operator+(&local_78,&local_98,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_78);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void CovergroupDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: covergroup = child.token(); return;
        case 2: name = child.token(); return;
        case 3: portList = child.node() ? &child.node()->as<FunctionPortListSyntax>() : nullptr; return;
        case 4: event = child.node() ? &child.node()->as<SyntaxNode>() : nullptr; return;
        case 5: semi = child.token(); return;
        case 6: members = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 7: endgroup = child.token(); return;
        case 8: endBlockName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}